

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O1

int Saig_ManExtendOneEval(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  iVar2 = *(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
  if ((-1 < (long)iVar2) && (iVar3 = vSimInfo->nSize, iVar2 < iVar3)) {
    ppvVar4 = vSimInfo->pArray;
    lVar8 = (long)(iFrame >> 4);
    bVar6 = (char)iFrame * '\x02' & 0x1e;
    uVar10 = *(uint *)((long)ppvVar4[iVar2] + lVar8 * 4) >> bVar6 & 3;
    uVar5 = 2;
    if (uVar10 != 1) {
      uVar5 = (uint)(uVar10 != 2) * 2 + 1;
    }
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      uVar5 = uVar10;
    }
    uVar10 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar10 & 7) == 3) {
      lVar7 = (long)pObj->Id;
      if ((-1 < lVar7) && (pObj->Id < iVar3)) {
        if (uVar5 == 0) {
          __assert_fail("Value >= SAIG_ZER && Value <= SAIG_UND",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                        ,0x3d,"void Saig_ManSimInfoSet(Vec_Ptr_t *, Aig_Obj_t *, int, int)");
        }
LAB_0058f96d:
        puVar1 = (uint *)((long)ppvVar4[lVar7] + lVar8 * 4);
        uVar10 = *puVar1;
        *puVar1 = (uVar10 >> bVar6 & 3 ^ uVar5) << bVar6 ^ uVar10;
        return uVar5;
      }
    }
    else {
      if ((uVar10 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                      ,0x9a,"int Saig_ManExtendOneEval(Vec_Ptr_t *, Aig_Obj_t *, int)");
      }
      iVar2 = *(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24);
      if ((-1 < (long)iVar2) && (iVar2 < iVar3)) {
        lVar7 = (long)pObj->Id;
        if ((-1 < lVar7) && (pObj->Id < iVar3)) {
          uVar9 = *(uint *)((long)ppvVar4[iVar2] + lVar8 * 4) >> bVar6 & 3;
          uVar10 = 2;
          if (uVar9 != 1) {
            uVar10 = (uVar9 != 2) + 1 + (uint)(uVar9 != 2);
          }
          if (((ulong)pObj->pFanin1 & 1) == 0) {
            uVar10 = uVar9;
          }
          uVar9 = (uVar10 == 2 && uVar5 == 2) ^ 3;
          if (uVar10 == 1) {
            uVar9 = 1;
          }
          if (uVar5 != 1) {
            uVar5 = uVar9;
          }
          goto LAB_0058f96d;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManExtendOneEval( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value0 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Saig_ManSimInfoNot( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    Value1 = Saig_ManSimInfoGet( vSimInfo, Aig_ObjFanin1(pObj), iFrame );
    if ( Aig_ObjFaninC1(pObj) )
        Value1 = Saig_ManSimInfoNot( Value1 );
    Value = Saig_ManSimInfoAnd( Value0, Value1 );
    Saig_ManSimInfoSet( vSimInfo, pObj, iFrame, Value );
    return Value;
}